

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  rle16_t rVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  array_container_t *paVar5;
  bitset_container_t *pbVar6;
  array_container_t *newanswer_1;
  uint32_t end_1;
  rle16_t rle_2;
  int32_t rlepos_2;
  uint32_t start_1;
  bitset_container_t *answer_2;
  array_container_t *newanswer;
  uint32_t end;
  rle16_t rle_1;
  int32_t rlepos_1;
  uint32_t start;
  bitset_container_t *answer_1;
  uint32_t runValue;
  uint32_t endofrun;
  rle16_t rle;
  int32_t rlepos;
  array_container_t *answer;
  int32_t card;
  container_t **dst_local;
  bitset_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var2 = run_container_is_full(src_1);
  if (_Var2) {
    if ((bitset_container_t *)*dst != src_2) {
      pbVar6 = bitset_container_clone(src_2);
      *dst = pbVar6;
    }
    src_1_local._7_1_ = true;
  }
  else {
    answer._4_4_ = run_container_cardinality(src_1);
    if (answer._4_4_ < 0x1001) {
      if (src_2->cardinality < answer._4_4_) {
        answer._4_4_ = src_2->cardinality;
      }
      paVar5 = array_container_create_given_capacity(answer._4_4_);
      *dst = paVar5;
      if (*dst == (container_t *)0x0) {
        src_1_local._7_1_ = false;
      }
      else {
        for (endofrun = 0; (int)endofrun < src_1->n_runs; endofrun = endofrun + 1) {
          rVar1 = src_1->runs[(int)endofrun];
          for (answer_1._0_4_ = (uint)rVar1 & 0xffff;
              (uint)answer_1 <= ((uint)rVar1 & 0xffff) + ((uint)rVar1 >> 0x10);
              answer_1._0_4_ = (uint)answer_1 + 1) {
            paVar5->array[paVar5->cardinality] = (uint16_t)(uint)answer_1;
            _Var2 = bitset_container_contains(src_2,(uint16_t)(uint)answer_1);
            paVar5->cardinality = (uint)_Var2 + paVar5->cardinality;
          }
        }
        src_1_local._7_1_ = false;
      }
    }
    else if ((bitset_container_t *)*dst == src_2) {
      pbVar6 = (bitset_container_t *)*dst;
      rle_1.value = 0;
      rle_1.length = 0;
      for (end = 0; (int)end < src_1->n_runs; end = end + 1) {
        rVar1 = src_1->runs[(int)end];
        uVar3 = (uint)rVar1 & 0xffff;
        bitset_reset_range(src_2->words,(uint32_t)rle_1,uVar3);
        rle_1 = (rle16_t)(uVar3 + ((uint)rVar1 >> 0x10) + 1);
      }
      bitset_reset_range(src_2->words,(uint32_t)rle_1,0x10000);
      iVar4 = bitset_container_compute_cardinality(pbVar6);
      pbVar6->cardinality = iVar4;
      if (src_2->cardinality < 0x1001) {
        paVar5 = array_container_from_bitset(src_2);
        if (paVar5 == (array_container_t *)0x0) {
          *dst = (container_t *)0x0;
          src_1_local._7_1_ = false;
        }
        else {
          *dst = paVar5;
          src_1_local._7_1_ = false;
        }
      }
      else {
        src_1_local._7_1_ = true;
      }
    }
    else {
      pbVar6 = bitset_container_clone(src_2);
      *dst = pbVar6;
      if (pbVar6 == (bitset_container_t *)0x0) {
        src_1_local._7_1_ = true;
      }
      else {
        rle_2.value = 0;
        rle_2.length = 0;
        for (end_1 = 0; (int)end_1 < src_1->n_runs; end_1 = end_1 + 1) {
          rVar1 = src_1->runs[(int)end_1];
          uVar3 = (uint)rVar1 & 0xffff;
          bitset_reset_range(pbVar6->words,(uint32_t)rle_2,uVar3);
          rle_2 = (rle16_t)(uVar3 + ((uint)rVar1 >> 0x10) + 1);
        }
        bitset_reset_range(pbVar6->words,(uint32_t)rle_2,0x10000);
        iVar4 = bitset_container_compute_cardinality(pbVar6);
        pbVar6->cardinality = iVar4;
        if (pbVar6->cardinality < 0x1001) {
          paVar5 = array_container_from_bitset(pbVar6);
          bitset_container_free((bitset_container_t *)*dst);
          if (paVar5 == (array_container_t *)0x0) {
            *dst = (container_t *)0x0;
            src_1_local._7_1_ = false;
          }
          else {
            *dst = paVar5;
            src_1_local._7_1_ = false;
          }
        }
        else {
          src_1_local._7_1_ = true;
        }
      }
    }
  }
  return src_1_local._7_1_;
}

Assistant:

bool run_bitset_container_intersection(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}